

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldOptions::IsInitialized(FieldOptions *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  UninterpretedOption *pUVar4;
  int local_1c;
  int i;
  FieldOptions *this_local;
  
  local_1c = 0;
  while( true ) {
    iVar2 = uninterpreted_option_size(this);
    if (iVar2 <= local_1c) {
      bVar1 = internal::ExtensionSet::IsInitialized(&this->_extensions_);
      return bVar1;
    }
    pUVar4 = uninterpreted_option(this,local_1c);
    uVar3 = (*(pUVar4->super_Message).super_MessageLite._vptr_MessageLite[5])();
    if ((uVar3 & 1) == 0) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool FieldOptions::IsInitialized() const {

  for (int i = 0; i < uninterpreted_option_size(); i++) {
    if (!this->uninterpreted_option(i).IsInitialized()) return false;
  }

  if (!_extensions_.IsInitialized()) return false;  return true;
}